

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

int lyxml_print_file(FILE *stream,lyxml_elem *elem,int options)

{
  undefined1 local_48 [8];
  lyout out;
  int options_local;
  lyxml_elem *elem_local;
  FILE *stream_local;
  
  if ((stream == (FILE *)0x0) || (elem == (lyxml_elem *)0x0)) {
    stream_local._4_4_ = 0;
  }
  else {
    local_48._0_4_ = LYOUT_STREAM;
    out._0_8_ = stream;
    out.method.mem.size._4_4_ = options;
    if ((options & 0x10U) == 0) {
      stream_local._4_4_ = dump_elem((lyout *)local_48,elem,0,options,1);
    }
    else {
      stream_local._4_4_ = dump_siblings((lyout *)local_48,elem,options);
    }
  }
  return stream_local._4_4_;
}

Assistant:

API int
lyxml_print_file(FILE *stream, const struct lyxml_elem *elem, int options)
{
    struct lyout out;

    if (!stream || !elem) {
        return 0;
    }

    out.type = LYOUT_STREAM;
    out.method.f = stream;

    if (options & LYXML_PRINT_SIBLINGS) {
        return dump_siblings(&out, elem, options);
    } else {
        return dump_elem(&out, elem, 0, options, 1);
    }
}